

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int read_header(archive_read *a,archive_entry *entry)

{
  char cVar1;
  mtree *mtree;
  __mode_t p;
  int iVar2;
  int iVar3;
  mode_t mVar4;
  int *piVar5;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar6;
  archive_string *paVar7;
  size_t sVar8;
  mtree_entry *pmVar9;
  mtree_entry *pmVar10;
  ulong uVar11;
  mtree_option **global_00;
  mtree_entry **ppmVar12;
  size_t len;
  la_int64_t lVar13;
  char *pcVar14;
  byte *pbVar15;
  char *pcVar16;
  ulong uVar17;
  size_t sVar18;
  mtree_entry *pmVar19;
  mtree_option *pmVar20;
  __dev_t _Var21;
  ulong uVar22;
  uint uVar23;
  mtree_entry *pmVar24;
  mtree_entry *__s_00;
  long lVar25;
  char *pcVar26;
  uint local_fc;
  mtree_option *global;
  char *local_f0;
  mtree_entry *local_e8;
  mtree_entry *local_e0;
  archive_entry *sparse_entry;
  mtree_entry **local_d0;
  mtree_entry *local_c8;
  stat st_storage;
  
  mtree = (mtree *)a->format->data;
  if (-1 < mtree->fd) {
    close(mtree->fd);
    mtree->fd = -1;
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      return -0x1e;
    }
    local_c8 = (mtree_entry *)&mtree->entries;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = 0x80000;
    mtree->archive_format_name = "mtree";
    global = (mtree_option *)0x0;
    detect_form(a,(int *)&sparse_entry);
    local_d0 = mtree->entry_hashtable;
    local_e8 = (mtree_entry *)0x0;
    local_f0 = (char *)0x1;
LAB_00462211:
    lVar25 = 0;
    uVar17 = 0;
    while (__s = __archive_read_ahead(a,1,(ssize_t *)&st_storage), _Var21 = st_storage.st_dev,
          __s != (void *)0x0) {
      if ((long)st_storage.st_dev < 0) goto LAB_0046295f;
      pvVar6 = memchr(__s,10,st_storage.st_dev);
      if (pvVar6 != (void *)0x0) {
        _Var21 = (long)pvVar6 + (1 - (long)__s);
        st_storage.st_dev = _Var21;
      }
      if (0xffff < (long)(_Var21 + uVar17)) {
        pcVar14 = "Line too long";
        iVar2 = 0x54;
        goto LAB_00462953;
      }
      paVar7 = archive_string_ensure((archive_string *)mtree,_Var21 + uVar17 + 1);
      if (paVar7 == (archive_string *)0x0) {
        pcVar14 = "Can\'t allocate working buffer";
        iVar2 = 0xc;
        goto LAB_00462953;
      }
      memcpy((mtree->line).s + uVar17,__s,st_storage.st_dev);
      __archive_read_consume(a,st_storage.st_dev);
      _Var21 = st_storage.st_dev;
      iVar2 = (int)sparse_entry;
      uVar22 = st_storage.st_dev + uVar17;
      (mtree->line).s[uVar22] = '\0';
      pmVar19 = (mtree_entry *)(mtree->line).s;
      pcVar14 = (char *)((long)&pmVar19->next + lVar25);
LAB_004622d5:
      cVar1 = *pcVar14;
      if (cVar1 == '#') {
        if (pvVar6 == (void *)0x0) goto LAB_00462318;
LAB_00462306:
        pcVar14 = pcVar14 + 1;
        goto LAB_004622d5;
      }
      if (cVar1 != '\\') {
        if (cVar1 == '\0') goto LAB_00462318;
        if (cVar1 == '\n') {
          if (uVar22 == 0) break;
          if ((long)uVar22 < 0) goto LAB_00462963;
          lVar25 = 0;
          pmVar24 = pmVar19;
          goto LAB_00462340;
        }
        goto LAB_00462306;
      }
      if (pcVar14[1] == '\0') goto LAB_00462306;
      if (pcVar14[1] != '\n') {
        pcVar14 = pcVar14 + 1;
        goto LAB_00462306;
      }
      *(char *)((long)pmVar19 + (uVar22 - 2)) = '\0';
      pmVar19 = (mtree_entry *)(mtree->line).s;
      uVar22 = uVar22 - 2;
LAB_00462318:
      uVar17 = uVar22;
      lVar25 = (long)pcVar14 - (long)pmVar19;
    }
    mtree->this_entry = mtree->entries;
    uVar22 = 0;
    goto LAB_00462963;
  }
LAB_00461dce:
  (a->archive).archive_format = mtree->archive_format;
  (a->archive).archive_format_name = mtree->archive_format_name;
  paVar7 = &mtree->current_dir;
  pmVar19 = mtree->this_entry;
  do {
    if (pmVar19 == (mtree_entry *)0x0) {
      return 1;
    }
    pcVar14 = pmVar19->name;
    if (((*pcVar14 == '.') && (pcVar14[1] == '.')) && (pcVar14[2] == '\0')) {
      pmVar19->used = '\x01';
      sVar18 = (mtree->current_dir).length;
      if (sVar18 != 0) {
        pcVar14 = paVar7->s;
        pcVar16 = pcVar14 + sVar18;
        do {
          pcVar26 = pcVar16;
          pcVar16 = pcVar26 + -1;
          if (pcVar16 < pcVar14) break;
        } while (*pcVar16 != '/');
        pcVar26 = pcVar26 + -2;
        if (pcVar16 < pcVar14) {
          pcVar26 = pcVar16;
        }
        (mtree->current_dir).length = (size_t)(pcVar26 + (1 - (long)pcVar14));
      }
    }
    else if (pmVar19->used == '\0') {
      pmVar19->used = '\x01';
      global = (mtree_option *)entry;
      archive_entry_set_filetype(entry,0x8000);
      archive_entry_set_size(entry,0);
      (mtree->contents_name).length = 0;
      local_fc = 0;
      iVar2 = parse_line(a,entry,mtree,pmVar19,(int *)&local_fc);
      if (pmVar19->full == '\0') {
        sVar18 = (mtree->current_dir).length;
        if (sVar18 != 0) {
          archive_strcat(paVar7,"/");
        }
        archive_strcat(paVar7,pmVar19->name);
        archive_entry_copy_pathname(entry,paVar7->s);
        mVar4 = archive_entry_filetype(entry);
        if (mVar4 != 0x4000) {
          (mtree->current_dir).length = sVar18;
        }
      }
      else {
        archive_entry_copy_pathname(entry,pmVar19->name);
        pmVar24 = pmVar19;
        while (pmVar24 = pmVar24->hashtable_next, pmVar24 != (mtree_entry *)0x0) {
          if (((pmVar24->full != '\0') && (pmVar24->used == '\0')) &&
             ((pmVar19->name_hash == pmVar24->name_hash &&
              (iVar3 = strcmp(pmVar19->name,pmVar24->name), iVar3 == 0)))) {
            pmVar24->used = '\x01';
            iVar3 = parse_line(a,entry,mtree,pmVar24,(int *)&local_fc);
            if (iVar3 < iVar2) {
              iVar2 = iVar3;
            }
          }
        }
      }
      if (mtree->checkfs == '\0') goto LAB_004628e9;
      mtree->fd = -1;
      if ((mtree->contents_name).length == 0) {
        pcVar14 = archive_entry_pathname(entry);
      }
      else {
        pcVar14 = (mtree->contents_name).s;
      }
      mVar4 = archive_entry_filetype(entry);
      if ((mVar4 == 0x8000) || (mVar4 = archive_entry_filetype(entry), mVar4 == 0x4000)) {
        iVar3 = open(pcVar14,0x80000);
        mtree->fd = iVar3;
        __archive_ensure_cloexec_flag(iVar3);
        iVar3 = mtree->fd;
        if (iVar3 == -1) {
          piVar5 = __errno_location();
          if ((*piVar5 != 2) || ((mtree->contents_name).length != 0)) {
            archive_set_error(&a->archive,*piVar5,"Can\'t open %s",pcVar14);
            iVar2 = -0x14;
          }
          goto LAB_00461fcf;
        }
      }
      else {
LAB_00461fcf:
        iVar3 = mtree->fd;
      }
      if (iVar3 < 0) {
        iVar3 = lstat(pcVar14,(stat *)&st_storage);
        if (iVar3 == -1) goto LAB_00462063;
LAB_00462025:
        p = st_storage.st_mode;
        uVar23 = st_storage.st_mode & 0xf000;
        if (uVar23 == 0xa000) {
          mVar4 = archive_entry_filetype(entry);
          if (mVar4 != 0xa000) goto LAB_004620da;
        }
        else if ((uVar23 != 0x8000) || (mVar4 = archive_entry_filetype(entry), mVar4 != 0x8000)) {
LAB_004620da:
          if (((~p & 0xc000) != 0) || (mVar4 = archive_entry_filetype(entry), mVar4 != 0xc000)) {
            switch(uVar23 - 0x1000 >> 0xc) {
            case 0:
              mVar4 = archive_entry_filetype(entry);
              if (mVar4 == 0x1000) goto LAB_004627b1;
              break;
            case 1:
              mVar4 = archive_entry_filetype(entry);
              if (mVar4 == 0x2000) goto LAB_004627b1;
              break;
            case 3:
              mVar4 = archive_entry_filetype(entry);
              if (mVar4 == 0x4000) goto LAB_004627b1;
              break;
            case 5:
              mVar4 = archive_entry_filetype(entry);
              if (mVar4 == 0x6000) goto LAB_004627b1;
            }
            if (-1 < mtree->fd) {
              close(mtree->fd);
            }
            mtree->fd = -1;
            if ((local_fc & 0x800) == 0) {
              if (iVar2 != 0) {
                return iVar2;
              }
              pcVar14 = archive_entry_pathname(entry);
              archive_set_error(&a->archive,-1,"mtree specification has different type for %s",
                                pcVar14);
              return -0x14;
            }
            goto LAB_00462191;
          }
        }
LAB_004627b1:
        uVar23 = local_fc;
        if (((local_fc & 0x1001) != 1) &&
           ((mVar4 = archive_entry_filetype(entry), mVar4 == 0x2000 ||
            (mVar4 = archive_entry_filetype(entry), mVar4 == 0x6000)))) {
          archive_entry_set_rdev(entry,st_storage.st_rdev);
        }
        if ((uVar23 & 0xc) == 0 || (uVar23 >> 0xc & 1) != 0) {
          archive_entry_set_gid(entry,(ulong)st_storage.st_gid);
        }
        if ((uVar23 & 0x600) == 0 || (uVar23 >> 0xc & 1) != 0) {
          archive_entry_set_uid(entry,(ulong)st_storage.st_uid);
        }
        if ((uVar23 & 0x1010) != 0x10) {
          archive_entry_set_mtime(entry,st_storage.st_mtim.tv_sec,st_storage.st_mtim.tv_nsec);
        }
        if ((uVar23 & 0x1020) != 0x20) {
          archive_entry_set_nlink(entry,(uint)st_storage.st_nlink);
        }
        if ((uVar23 & 0x1040) != 0x40) {
          archive_entry_set_perm(entry,p);
        }
        if ((uVar23 & 0x1080) != 0x80) {
          archive_entry_set_size(entry,st_storage.st_size);
        }
        archive_entry_set_ino(entry,st_storage.st_ino);
        archive_entry_set_dev(entry,st_storage.st_dev);
        archive_entry_linkify(mtree->resolver,(archive_entry **)&global,&sparse_entry);
        entry = (archive_entry *)global;
LAB_004628e9:
        lVar13 = archive_entry_size(entry);
        mtree->cur_size = lVar13;
        mtree->offset = 0;
        return iVar2;
      }
      iVar3 = fstat(iVar3,(stat *)&st_storage);
      if (iVar3 != -1) goto LAB_00462025;
      piVar5 = __errno_location();
      archive_set_error(&a->archive,*piVar5,"Could not fstat %s",pcVar14);
      close(mtree->fd);
      mtree->fd = -1;
      iVar2 = -0x14;
LAB_00462063:
      if ((local_fc & 0x800) == 0) goto LAB_004628e9;
LAB_00462191:
      pmVar19 = mtree->this_entry;
    }
    pmVar19 = pmVar19->next;
    mtree->this_entry = pmVar19;
  } while( true );
LAB_00462340:
  pmVar24 = (mtree_entry *)((long)&pmVar24->next + 1);
  uVar22 = (ulong)*(byte *)((long)&pmVar19->next + lVar25);
  if (0x2f < uVar22) goto LAB_00462488;
  if ((0x100000200U >> (uVar22 & 0x3f) & 1) == 0) {
    if ((0x800002401U >> (uVar22 & 0x3f) & 1) != 0) goto LAB_0046236e;
    if (uVar22 == 0x2f) {
      uVar17 = (st_storage.st_dev + uVar17) - lVar25;
      if ((long)uVar17 < 5) {
LAB_0046298f:
        archive_set_error(&a->archive,0x54,"Can\'t parse line %ju",local_f0);
      }
      else {
        pcVar14 = (char *)((long)&pmVar19->next + lVar25);
        iVar2 = strncmp(pcVar14,"/set",4);
        if (iVar2 == 0) {
          cVar1 = *(char *)((long)&pmVar19->next + lVar25 + 4);
          if ((cVar1 != ' ') && (cVar1 != '\t')) goto LAB_0046298f;
          pcVar14 = (char *)((long)&pmVar19->next + lVar25 + 4);
          goto LAB_00462590;
        }
        if (((uVar17 < 7) || (iVar2 = strncmp(pcVar14,"/unset",6), iVar2 != 0)) ||
           ((cVar1 = *(char *)((long)&pmVar19->next + lVar25 + 6), cVar1 != ' ' && (cVar1 != '\t')))
           ) goto LAB_0046298f;
        pcVar16 = (char *)((long)&pmVar19->next + lVar25 + 6);
        pcVar14 = strchr(pcVar16,0x3d);
        if (pcVar14 == (char *)0x0) goto LAB_0046246f;
        archive_set_error(&a->archive,-1,"/unset shall not contain `=\'");
      }
      iVar2 = -0x1e;
      goto LAB_00462967;
    }
    goto LAB_00462488;
  }
  lVar25 = lVar25 + 1;
  goto LAB_00462340;
LAB_00462590:
  sVar8 = strspn(pcVar14," \t\r\n");
  if (pcVar14[sVar8] == '\0') goto LAB_0046236e;
  pcVar26 = pcVar14 + sVar8;
  sVar8 = strcspn(pcVar26," \t\r\n");
  pcVar14 = pcVar26 + sVar8;
  pcVar16 = strchr(pcVar26,0x3d);
  sVar18 = (long)pcVar16 - (long)pcVar26;
  if (pcVar14 < pcVar16) {
    sVar18 = sVar8;
  }
  remove_option(&global,pcVar26,sVar18);
  uVar23 = add_option(a,&global,pcVar26,sVar8);
  if (uVar23 != 0) goto LAB_00462939;
  goto LAB_00462590;
LAB_0046246f:
  while( true ) {
    sVar8 = strspn(pcVar16," \t\r\n");
    cVar1 = pcVar16[sVar8];
    if (cVar1 == '\0') break;
    pcVar16 = pcVar16 + sVar8;
    sVar8 = strcspn(pcVar16," \t\r\n");
    if (((cVar1 == 'a' && sVar8 == 3) && (pcVar16[1] == 'l')) && (pcVar16[2] == 'l')) {
      free_options(global);
      global = (mtree_option *)0x0;
    }
    else {
      remove_option(&global,pcVar16,sVar8);
    }
    pcVar16 = pcVar16 + sVar8;
  }
LAB_0046236e:
  local_f0 = local_f0 + 1;
  goto LAB_00462211;
LAB_00462488:
  pmVar9 = (mtree_entry *)malloc(0x28);
  if (pmVar9 != (mtree_entry *)0x0) {
    __s_00 = (mtree_entry *)((long)&pmVar19->next + lVar25);
    pmVar9->name_hash = 0;
    pmVar9->hashtable_next = (mtree_entry *)0x0;
    uVar22 = (_Var21 + uVar17) - lVar25;
    pmVar9->next = (mtree_entry *)0x0;
    pmVar9->options = (mtree_option *)0x0;
    *(undefined8 *)((long)&pmVar9->options + 2) = 0;
    *(undefined8 *)((long)&pmVar9->name + 2) = 0;
    pmVar10 = local_e8;
    if (local_e8 == (mtree_entry *)0x0) {
      pmVar10 = local_c8;
    }
    pmVar10->next = pmVar9;
    local_e0 = pmVar9;
    if (iVar2 == 0) {
      pcVar14 = (char *)strcspn((char *)__s_00," \t\r\n");
      pmVar19 = (mtree_entry *)(pcVar14 + (long)(lVar25 + (long)&pmVar19->next));
      local_e8 = (mtree_entry *)(uVar22 + (long)pmVar19);
    }
    else {
      uVar11 = (long)uVar22 >> 0x3f & uVar22;
      pbVar15 = (byte *)((long)&pmVar19->next + _Var21 + uVar17);
      while (((pbVar15 = pbVar15 + -1, uVar17 = uVar11, 0 < (long)uVar22 &&
              (uVar17 = uVar22, (ulong)*pbVar15 < 0x21)) &&
             ((0x100002600U >> ((ulong)*pbVar15 & 0x3f) & 1) != 0))) {
        uVar22 = uVar22 - 1;
      }
      uVar22 = 0;
      local_e8 = __s_00;
      if (0 < (long)uVar17) {
        uVar22 = uVar17;
      }
      while (uVar22 != 0) {
        uVar11 = (ulong)*(byte *)((long)&pmVar24[-1].hashtable_next + 7);
        if ((uVar11 < 0x21) && ((0x100002600U >> (uVar11 & 0x3f) & 1) != 0)) {
          local_e8 = pmVar24;
        }
        pmVar24 = (mtree_entry *)((long)&pmVar24->next + 1);
        uVar22 = uVar22 - 1;
      }
      pcVar14 = (char *)((long)pmVar19 + lVar25 + (uVar17 - (long)local_e8));
      pmVar19 = __s_00;
      __s_00 = local_e8;
    }
    pcVar16 = (char *)malloc((size_t)(pcVar14 + 1));
    local_e0->name = pcVar16;
    if (pcVar16 != (char *)0x0) {
      global_00 = &local_e0->options;
      memcpy(pcVar16,__s_00,(size_t)pcVar14);
      pcVar16[(long)pcVar14] = '\0';
      parse_escapes(pcVar16,local_e0);
      pcVar14 = local_e0->name;
      uVar23 = 0;
      while (cVar1 = *pcVar14, cVar1 != '\0') {
        pcVar14 = pcVar14 + 1;
        uVar23 = uVar23 * 0x10 + (int)cVar1;
        if ((uVar23 & 0xf0000000) != 0) {
          uVar23 = uVar23 & 0xfffffff ^ (uVar23 & 0xf0000000) >> 0x18;
        }
      }
      local_e0->name_hash = uVar23;
      pmVar24 = local_d0[uVar23 & 0x3ff];
      if (local_d0[uVar23 & 0x3ff] == (mtree_entry *)0x0) {
        ppmVar12 = local_d0 + (uVar23 & 0x3ff);
      }
      else {
        do {
          pmVar9 = pmVar24;
          pmVar24 = pmVar9->hashtable_next;
        } while (pmVar24 != (mtree_entry *)0x0);
        ppmVar12 = &pmVar9->hashtable_next;
      }
      *ppmVar12 = local_e0;
      pmVar20 = (mtree_option *)&global;
      while (pmVar20 = pmVar20->next, pmVar20 != (mtree_option *)0x0) {
        pcVar14 = pmVar20->value;
        sVar8 = strlen(pcVar14);
        uVar23 = add_option(a,global_00,pcVar14,sVar8);
        if (uVar23 != 0) goto LAB_00462939;
      }
      while ((sVar8 = strspn((char *)pmVar19," \t\r\n"),
             *(char *)((long)&pmVar19->next + sVar8) != '\0' &&
             (pmVar24 = (mtree_entry *)((long)&pmVar19->next + sVar8), pmVar24 < local_e8))) {
        len = strcspn((char *)pmVar24," \t\r\n");
        pmVar19 = (mtree_entry *)((long)&pmVar24->next + len);
        pmVar9 = (mtree_entry *)strchr((char *)pmVar24,0x3d);
        sVar8 = (long)pmVar9 - (long)pmVar24;
        if (pmVar19 < pmVar9) {
          sVar8 = len;
        }
        if (pmVar9 == (mtree_entry *)0x0) {
          sVar8 = len;
        }
        remove_option(global_00,(char *)pmVar24,sVar8);
        uVar23 = add_option(a,global_00,(char *)pmVar24,len);
        if (uVar23 != 0) goto LAB_00462939;
      }
      local_e8 = local_e0;
      goto LAB_0046236e;
    }
  }
  piVar5 = __errno_location();
  iVar2 = *piVar5;
  pcVar14 = "Can\'t allocate memory";
LAB_00462953:
  archive_set_error(&a->archive,iVar2,pcVar14);
LAB_0046295f:
  uVar22 = 0xffffffffffffffe2;
  goto LAB_00462963;
LAB_00462939:
  uVar22 = (ulong)uVar23;
LAB_00462963:
  iVar2 = (int)uVar22;
LAB_00462967:
  free_options(global);
  if (iVar2 != 0) {
    return iVar2;
  }
  goto LAB_00461dce;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry,
            char head_type)
{
  const void *h;
  const char *p, *endp;
  struct rar *rar;
  struct rar_header rar_header;
  struct rar_file_header file_header;
  int64_t header_size;
  unsigned filename_size, end;
  char *filename;
  char *strp;
  char packed_size[8];
  char unp_size[8];
  int ttime;
  struct archive_string_conv *sconv, *fn_sconv;
  unsigned long crc32_val;
  int ret = (ARCHIVE_OK), ret2;

  rar = (struct rar *)(a->format->data);

  /* Setup a string conversion object for non-rar-unicode filenames. */
  sconv = rar->opt_sconv;
  if (sconv == NULL) {
    if (!rar->init_default_conversion) {
      rar->sconv_default =
          archive_string_default_conversion_for_read(
            &(a->archive));
      rar->init_default_conversion = 1;
    }
    sconv = rar->sconv_default;
  }


  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);
  p = h;
  memcpy(&rar_header, p, sizeof(rar_header));
  rar->file_flags = archive_le16dec(rar_header.flags);
  header_size = archive_le16dec(rar_header.size);
  if (header_size < (int64_t)sizeof(file_header) + 7) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid header size");
    return (ARCHIVE_FATAL);
  }
  crc32_val = crc32(0, (const unsigned char *)p + 2, 7 - 2);
  __archive_read_consume(a, 7);

  if (!(rar->file_flags & FHD_SOLID))
  {
    rar->compression_method = 0;
    rar->packed_size = 0;
    rar->unp_size = 0;
    rar->mtime = 0;
    rar->ctime = 0;
    rar->atime = 0;
    rar->arctime = 0;
    rar->mode = 0;
    memset(&rar->salt, 0, sizeof(rar->salt));
    rar->atime = 0;
    rar->ansec = 0;
    rar->ctime = 0;
    rar->cnsec = 0;
    rar->mtime = 0;
    rar->mnsec = 0;
    rar->arctime = 0;
    rar->arcnsec = 0;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR solid archive support unavailable.");
    return (ARCHIVE_FATAL);
  }

  if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);

  /* File Header CRC check. */
  crc32_val = crc32(crc32_val, h, (unsigned)(header_size - 7));
  if ((crc32_val & 0xffff) != archive_le16dec(rar_header.crc)) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Header CRC error");
    return (ARCHIVE_FATAL);
  }
  /* If no CRC error, Go on parsing File Header. */
  p = h;
  endp = p + header_size - 7;
  memcpy(&file_header, p, sizeof(file_header));
  p += sizeof(file_header);

  rar->compression_method = file_header.method;

  ttime = archive_le32dec(file_header.file_time);
  rar->mtime = get_time(ttime);

  rar->file_crc = archive_le32dec(file_header.file_crc);

  if (rar->file_flags & FHD_PASSWORD)
  {
	archive_entry_set_is_data_encrypted(entry, 1);
	rar->has_encrypted_entries = 1;
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR encryption support unavailable.");
    /* Since it is only the data part itself that is encrypted we can at least
       extract information about the currently processed entry and don't need
       to return ARCHIVE_FATAL here. */
    /*return (ARCHIVE_FATAL);*/
  }

  if (rar->file_flags & FHD_LARGE)
  {
    memcpy(packed_size, file_header.pack_size, 4);
    memcpy(packed_size + 4, p, 4); /* High pack size */
    p += 4;
    memcpy(unp_size, file_header.unp_size, 4);
    memcpy(unp_size + 4, p, 4); /* High unpack size */
    p += 4;
    rar->packed_size = archive_le64dec(&packed_size);
    rar->unp_size = archive_le64dec(&unp_size);
  }
  else
  {
    rar->packed_size = archive_le32dec(file_header.pack_size);
    rar->unp_size = archive_le32dec(file_header.unp_size);
  }

  if (rar->packed_size < 0 || rar->unp_size < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid sizes specified.");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_remaining = rar->packed_size;

  /* TODO: RARv3 subblocks contain comments. For now the complete block is
   * consumed at the end.
   */
  if (head_type == NEWSUB_HEAD) {
    size_t distance = p - (const char *)h;
    header_size += rar->packed_size;
    /* Make sure we have the extended data. */
    if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
        return (ARCHIVE_FATAL);
    p = h;
    endp = p + header_size - 7;
    p += distance;
  }

  filename_size = archive_le16dec(file_header.name_size);
  if (p + filename_size > endp) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid filename size");
    return (ARCHIVE_FATAL);
  }
  if (rar->filename_allocated < filename_size * 2 + 2) {
    char *newptr;
    size_t newsize = filename_size * 2 + 2;
    newptr = realloc(rar->filename, newsize);
    if (newptr == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Couldn't allocate memory.");
      return (ARCHIVE_FATAL);
    }
    rar->filename = newptr;
    rar->filename_allocated = newsize;
  }
  filename = rar->filename;
  memcpy(filename, p, filename_size);
  filename[filename_size] = '\0';
  if (rar->file_flags & FHD_UNICODE)
  {
    if (filename_size != strlen(filename))
    {
      unsigned char highbyte, flagbits, flagbyte;
      unsigned fn_end, offset;

      end = filename_size;
      fn_end = filename_size * 2;
      filename_size = 0;
      offset = (unsigned)strlen(filename) + 1;
      highbyte = *(p + offset++);
      flagbits = 0;
      flagbyte = 0;
      while (offset < end && filename_size < fn_end)
      {
        if (!flagbits)
        {
          flagbyte = *(p + offset++);
          flagbits = 8;
        }

        flagbits -= 2;
        switch((flagbyte >> flagbits) & 3)
        {
          case 0:
            filename[filename_size++] = '\0';
            filename[filename_size++] = *(p + offset++);
            break;
          case 1:
            filename[filename_size++] = highbyte;
            filename[filename_size++] = *(p + offset++);
            break;
          case 2:
            filename[filename_size++] = *(p + offset + 1);
            filename[filename_size++] = *(p + offset);
            offset += 2;
            break;
          case 3:
          {
            char extra, high;
            uint8_t length = *(p + offset++);

            if (length & 0x80) {
              extra = *(p + offset++);
              high = (char)highbyte;
            } else
              extra = high = 0;
            length = (length & 0x7f) + 2;
            while (length && filename_size < fn_end) {
              unsigned cp = filename_size >> 1;
              filename[filename_size++] = high;
              filename[filename_size++] = p[cp] + extra;
              length--;
            }
          }
          break;
        }
      }
      if (filename_size > fn_end) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid filename");
        return (ARCHIVE_FATAL);
      }
      filename[filename_size++] = '\0';
      filename[filename_size++] = '\0';

      /* Decoded unicode form is UTF-16BE, so we have to update a string
       * conversion object for it. */
      if (rar->sconv_utf16be == NULL) {
        rar->sconv_utf16be = archive_string_conversion_from_charset(
           &a->archive, "UTF-16BE", 1);
        if (rar->sconv_utf16be == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf16be;

      strp = filename;
      while (memcmp(strp, "\x00\x00", 2))
      {
        if (!memcmp(strp, "\x00\\", 2))
          *(strp + 1) = '/';
        strp += 2;
      }
      p += offset;
    } else {
      /*
       * If FHD_UNICODE is set but no unicode data, this file name form
       * is UTF-8, so we have to update a string conversion object for
       * it accordingly.
       */
      if (rar->sconv_utf8 == NULL) {
        rar->sconv_utf8 = archive_string_conversion_from_charset(
           &a->archive, "UTF-8", 1);
        if (rar->sconv_utf8 == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf8;
      while ((strp = strchr(filename, '\\')) != NULL)
        *strp = '/';
      p += filename_size;
    }
  }
  else
  {
    fn_sconv = sconv;
    while ((strp = strchr(filename, '\\')) != NULL)
      *strp = '/';
    p += filename_size;
  }

  /* Split file in multivolume RAR. No more need to process header. */
  if (rar->filename_save &&
    filename_size == rar->filename_save_size &&
    !memcmp(rar->filename, rar->filename_save, filename_size + 1))
  {
    __archive_read_consume(a, header_size - 7);
    rar->cursor++;
    if (rar->cursor >= rar->nodes)
    {
      rar->nodes++;
      if ((rar->dbo =
        realloc(rar->dbo, sizeof(*rar->dbo) * rar->nodes)) == NULL)
      {
        archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
        return (ARCHIVE_FATAL);
      }
      rar->dbo[rar->cursor].header_size = header_size;
      rar->dbo[rar->cursor].start_offset = -1;
      rar->dbo[rar->cursor].end_offset = -1;
    }
    if (rar->dbo[rar->cursor].start_offset < 0)
    {
      rar->dbo[rar->cursor].start_offset = a->filter->position;
      rar->dbo[rar->cursor].end_offset = rar->dbo[rar->cursor].start_offset +
        rar->packed_size;
    }
    return ret;
  }

  rar->filename_save = (char*)realloc(rar->filename_save,
                                      filename_size + 1);
  memcpy(rar->filename_save, rar->filename, filename_size + 1);
  rar->filename_save_size = filename_size;

  /* Set info for seeking */
  free(rar->dbo);
  if ((rar->dbo = calloc(1, sizeof(*rar->dbo))) == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
    return (ARCHIVE_FATAL);
  }
  rar->dbo[0].header_size = header_size;
  rar->dbo[0].start_offset = -1;
  rar->dbo[0].end_offset = -1;
  rar->cursor = 0;
  rar->nodes = 1;

  if (rar->file_flags & FHD_SALT)
  {
    if (p + 8 > endp) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
    memcpy(rar->salt, p, 8);
    p += 8;
  }

  if (rar->file_flags & FHD_EXTTIME) {
    if (read_exttime(p, rar, endp) < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
  }

  __archive_read_consume(a, header_size - 7);
  rar->dbo[0].start_offset = a->filter->position;
  rar->dbo[0].end_offset = rar->dbo[0].start_offset + rar->packed_size;

  switch(file_header.host_os)
  {
  case OS_MSDOS:
  case OS_OS2:
  case OS_WIN32:
    rar->mode = archive_le32dec(file_header.file_attr);
    if (rar->mode & FILE_ATTRIBUTE_DIRECTORY)
      rar->mode = AE_IFDIR | S_IXUSR | S_IXGRP | S_IXOTH;
    else
      rar->mode = AE_IFREG;
    rar->mode |= S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    break;

  case OS_UNIX:
  case OS_MAC_OS:
  case OS_BEOS:
    rar->mode = archive_le32dec(file_header.file_attr);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unknown file attributes from RAR file's host OS");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_uncopied = rar->bytes_unconsumed = 0;
  rar->lzss.position = rar->offset = 0;
  rar->offset_seek = 0;
  rar->dictionary_size = 0;
  rar->offset_outgoing = 0;
  rar->br.cache_avail = 0;
  rar->br.avail_in = 0;
  rar->crc_calculated = 0;
  rar->entry_eof = 0;
  rar->valid = 1;
  rar->is_ppmd_block = 0;
  rar->start_new_table = 1;
  free(rar->unp_buffer);
  rar->unp_buffer = NULL;
  rar->unp_offset = 0;
  rar->unp_buffer_size = UNP_BUFFER_SIZE;
  memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);
  rar->ppmd_valid = rar->ppmd_eod = 0;

  /* Don't set any archive entries for non-file header types */
  if (head_type == NEWSUB_HEAD)
    return ret;

  archive_entry_set_mtime(entry, rar->mtime, rar->mnsec);
  archive_entry_set_ctime(entry, rar->ctime, rar->cnsec);
  archive_entry_set_atime(entry, rar->atime, rar->ansec);
  archive_entry_set_size(entry, rar->unp_size);
  archive_entry_set_mode(entry, rar->mode);

  if (archive_entry_copy_pathname_l(entry, filename, filename_size, fn_sconv))
  {
    if (errno == ENOMEM)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Can't allocate memory for Pathname");
      return (ARCHIVE_FATAL);
    }
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Pathname cannot be converted from %s to current locale.",
                      archive_string_conversion_charset_name(fn_sconv));
    ret = (ARCHIVE_WARN);
  }

  if (((rar->mode) & AE_IFMT) == AE_IFLNK)
  {
    /* Make sure a symbolic-link file does not have its body. */
    rar->bytes_remaining = 0;
    archive_entry_set_size(entry, 0);

    /* Read a symbolic-link name. */
    if ((ret2 = read_symlink_stored(a, entry, sconv)) < (ARCHIVE_WARN))
      return ret2;
    if (ret > ret2)
      ret = ret2;
  }

  if (rar->bytes_remaining == 0)
    rar->entry_eof = 1;

  return ret;
}